

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O1

ZyanStatus
ZydisFormatterIntelFormatOperandMEM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanU8 ZVar2;
  ZydisMemoryOperandType ZVar3;
  ZydisRegister ZVar4;
  ZydisRegister ZVar5;
  ZyanUSize ZVar6;
  ulong uVar7;
  void *pvVar8;
  ZydisDecodedOperand *pZVar9;
  bool bVar10;
  ZyanStatus ZVar11;
  ZyanStatus ZVar12;
  ZyanStatus unaff_EBP;
  ZyanStatus ZVar13;
  ZyanUSize ZVar14;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,199,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,200,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0xc9,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar3 = (context->operand->field_10).mem.type;
  if (((ZVar3 < (ZYDIS_MEMOP_TYPE_MAX_VALUE|ZYDIS_MEMOP_TYPE_MEM)) &&
      ((0x16U >> (ZVar3 & 0x1f) & 1) != 0)) &&
     (unaff_EBP = (*formatter->func_print_typecast)(formatter,buffer,context), (int)unaff_EBP < 0))
  {
    return unaff_EBP;
  }
  ZVar11 = (*formatter->func_print_segment)(formatter,buffer,context);
  if ((int)ZVar11 < 0) {
    return ZVar11;
  }
  if (buffer->is_token_list == '\0') {
    if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00114eb4;
    ZVar6 = (buffer->string).vector.size;
    if (ZVar6 == 0) goto LAB_00114ed3;
    uVar7 = (buffer->string).vector.capacity;
    ZVar11 = 0x80100009;
    if (ZVar6 + 1 <= uVar7) {
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar6 - 1)) = 0x5b;
      ZVar14 = (buffer->string).vector.size;
      pvVar8 = (buffer->string).vector.data;
      (buffer->string).vector.size = ZVar14 + 1;
      ZVar11 = unaff_EBP;
      if (*(char *)((long)pvVar8 + ZVar14) != '\0') goto LAB_00114ef2;
    }
    if (uVar7 < ZVar6 + 1) {
      return ZVar11;
    }
  }
  else {
    ZVar6 = (buffer->string).vector.size;
    if (0xfe < ZVar6 - 1) goto LAB_00114e95;
    uVar7 = buffer->capacity;
    ZVar11 = 0x80100009;
    if (ZVar6 + 4 < uVar7) {
      pvVar8 = (buffer->string).vector.data;
      *(char *)((long)pvVar8 + -1) = (char)ZVar6;
      *(undefined4 *)((long)pvVar8 + ZVar6) = 0x5b0003;
      ZVar14 = buffer->capacity - (ZVar6 + 2);
      buffer->capacity = ZVar14;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + ZVar6 + 2);
      (buffer->string).vector.size = 2;
      if (0xfe < ZVar14) {
        ZVar14 = 0xff;
      }
      (buffer->string).vector.capacity = ZVar14;
      ZVar11 = unaff_EBP;
    }
    if (uVar7 <= ZVar6 + 4) {
      return ZVar11;
    }
  }
  if ((((formatter->force_relative_riprel == '\0') &&
       (context->runtime_address != 0xffffffffffffffff)) &&
      ((pZVar9 = context->operand, *(char *)((long)&pZVar9->field_10 + 0x21) != '\0' &&
       ((pZVar9->field_10).mem.index == ZYDIS_REGISTER_NONE)))) &&
     ((ZVar4 = (pZVar9->field_10).mem.base, ZVar4 - ZYDIS_REGISTER_EIP < 2 ||
      (ZVar4 == ZYDIS_REGISTER_NONE)))) {
    ZVar12 = (*formatter->func_print_address_abs)(formatter,buffer,context);
    if ((int)ZVar12 < 0) {
      return ZVar12;
    }
  }
  else {
    ZVar4 = (context->operand->field_10).mem.base;
    ZVar5 = (context->operand->field_10).mem.index;
    if ((ZVar4 != ZYDIS_REGISTER_NONE) &&
       (ZVar12 = (*formatter->func_print_register)(formatter,buffer,context,ZVar4), (int)ZVar12 < 0)
       ) goto LAB_00114d53;
    ZVar13 = ZVar11;
    if (ZVar5 == ZYDIS_REGISTER_NONE) goto LAB_00114caf;
    if ((context->operand->field_10).mem.base == ZYDIS_REGISTER_NONE) {
LAB_00114c4e:
      ZVar12 = (*formatter->func_print_register)
                         (formatter,buffer,context,(context->operand->field_10).mem.index);
      if ((int)ZVar12 < 0) {
LAB_00114d53:
        bVar10 = false;
        ZVar11 = ZVar12;
      }
      else {
        ZVar2 = (context->operand->field_10).mem.scale;
        if (((ZVar2 != '\0') && ((context->operand->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)) &&
           ((ZVar2 != '\x01' || (formatter->force_memory_scale != '\0')))) {
          if (buffer->is_token_list == '\0') {
            ZVar12 = ZydisStringAppendShort(&buffer->string,&STR_MUL);
          }
          else {
            ZVar12 = ZydisFormatterBufferAppendPredefined
                               (buffer,(ZydisPredefinedToken *)&TOK_DATA_MUL);
          }
          if (((int)ZVar12 < 0) ||
             ((buffer->is_token_list != '\0' &&
              (ZVar12 = ZydisFormatterBufferAppend(buffer,'\v'), (int)ZVar12 < 0))))
          goto LAB_00114d53;
          bVar10 = false;
          ZVar11 = ZydisStringAppendDecU
                             (&buffer->string,(ulong)(context->operand->field_10).mem.scale,'\0',
                              (ZyanStringView *)0x0,(ZyanStringView *)0x0);
          if ((int)ZVar11 < 0) goto LAB_00114d56;
        }
LAB_00114caf:
        if (ZVar4 == ZYDIS_REGISTER_NONE && ZVar5 == ZYDIS_REGISTER_NONE) {
          ZVar12 = (*formatter->func_print_address_abs)(formatter,buffer,context);
LAB_00114ce7:
          if ((int)ZVar12 < 0) goto LAB_00114d53;
        }
        else if ((*(char *)((long)&context->operand->field_10 + 0x21) != '\0') &&
                ((context->operand->field_10).mem.disp.value != 0)) {
          ZVar12 = (*formatter->func_print_disp)(formatter,buffer,context);
          goto LAB_00114ce7;
        }
        bVar10 = true;
        ZVar11 = ZVar13;
      }
    }
    else {
      if (buffer->is_token_list != '\0') {
        ZVar6 = (buffer->string).vector.size;
        if (0xfe < ZVar6 - 1) goto LAB_00114e95;
        uVar7 = buffer->capacity;
        ZVar12 = 0x80100009;
        if (ZVar6 + 4 < uVar7) {
          pvVar8 = (buffer->string).vector.data;
          *(char *)((long)pvVar8 + -1) = (char)ZVar6;
          *(undefined4 *)((long)pvVar8 + ZVar6) = 0x2b0002;
          ZVar14 = buffer->capacity - (ZVar6 + 2);
          buffer->capacity = ZVar14;
          ppvVar1 = &(buffer->string).vector.data;
          *ppvVar1 = (void *)((long)*ppvVar1 + ZVar6 + 2);
          (buffer->string).vector.size = 2;
          if (0xfe < ZVar14) {
            ZVar14 = 0xff;
          }
          (buffer->string).vector.capacity = ZVar14;
          ZVar12 = ZVar11;
        }
        ZVar13 = ZVar12;
        if (uVar7 <= ZVar6 + 4) goto LAB_00114d53;
        goto LAB_00114c4e;
      }
      ZVar11 = ZydisStringAppendShort(&buffer->string,&STR_ADD);
      if (-1 < (int)ZVar11) goto LAB_00114c4e;
      bVar10 = false;
    }
LAB_00114d56:
    if (!bVar10) {
      return ZVar11;
    }
  }
  if (buffer->is_token_list == '\0') {
    if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_00114eb4:
      __assert_fail("!destination->vector.allocator",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xeb,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    ZVar6 = (buffer->string).vector.size;
    if (ZVar6 == 0) {
LAB_00114ed3:
      __assert_fail("destination->vector.size && source->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xec,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    uVar7 = (buffer->string).vector.capacity;
    ZVar12 = 0x80100009;
    if (ZVar6 + 1 <= uVar7) {
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar6 - 1)) = 0x5d;
      ZVar14 = (buffer->string).vector.size;
      pvVar8 = (buffer->string).vector.data;
      (buffer->string).vector.size = ZVar14 + 1;
      ZVar12 = ZVar11;
      if (*(char *)((long)pvVar8 + ZVar14) != '\0') {
LAB_00114ef2:
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xf7,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
    }
    if (uVar7 < ZVar6 + 1) {
      return ZVar12;
    }
  }
  else {
    ZVar6 = (buffer->string).vector.size;
    if (0xfe < ZVar6 - 1) {
LAB_00114e95:
      __assert_fail("(len > 0) && (len < 256)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                    ,0xe7,
                    "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                   );
    }
    uVar7 = buffer->capacity;
    ZVar12 = 0x80100009;
    if (ZVar6 + 4 < uVar7) {
      pvVar8 = (buffer->string).vector.data;
      *(char *)((long)pvVar8 + -1) = (char)ZVar6;
      *(undefined4 *)((long)pvVar8 + ZVar6) = 0x5d0004;
      ZVar14 = buffer->capacity - (ZVar6 + 2);
      buffer->capacity = ZVar14;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + ZVar6 + 2);
      (buffer->string).vector.size = 2;
      if (0xfe < ZVar14) {
        ZVar14 = 0xff;
      }
      (buffer->string).vector.capacity = ZVar14;
      ZVar12 = ZVar11;
    }
    if (uVar7 <= ZVar6 + 4) {
      return ZVar12;
    }
  }
  return 0x100000;
}

Assistant:

ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    if ((context->operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
        (context->operand->mem.type == ZYDIS_MEMOP_TYPE_AGEN) ||
        (context->operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB))
    {
        ZYAN_CHECK(formatter->func_print_typecast(formatter, buffer, context));
    }
    ZYAN_CHECK(formatter->func_print_segment(formatter, buffer, context));

    ZYDIS_BUFFER_APPEND(buffer, MEMORY_BEGIN_INTEL);

    const ZyanBool absolute = !formatter->force_relative_riprel &&
        (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
    if (absolute && context->operand->mem.disp.size &&
        (context->operand->mem.index == ZYDIS_REGISTER_NONE) &&
       ((context->operand->mem.base  == ZYDIS_REGISTER_NONE) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_EIP ) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_RIP )))
    {
        // EIP/RIP-relative or absolute-displacement address operand
        ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
    } else
    {
        const ZyanBool should_print_reg = context->operand->mem.base != ZYDIS_REGISTER_NONE;
        const ZyanBool should_print_idx = context->operand->mem.index != ZYDIS_REGISTER_NONE;
        const ZyanBool neither_reg_nor_idx = !should_print_reg && !should_print_idx;

        // Regular memory operand
        if (should_print_reg)
        {
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.base));
        }
        if (should_print_idx)
        {
            if (context->operand->mem.base != ZYDIS_REGISTER_NONE)
            {
                ZYDIS_BUFFER_APPEND(buffer, ADD);
            }
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.index));
            if (context->operand->mem.scale &&
                (context->operand->mem.type != ZYDIS_MEMOP_TYPE_MIB) &&
                ((context->operand->mem.scale > 1) || formatter->force_memory_scale))
            {
                ZYDIS_BUFFER_APPEND(buffer, MUL);
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
                ZYAN_CHECK(ZydisStringAppendDecU(&buffer->string, context->operand->mem.scale, 0,
                    ZYAN_NULL, ZYAN_NULL));
            }
        }
        if (neither_reg_nor_idx)
        {
            ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
        } else if (context->operand->mem.disp.size && context->operand->mem.disp.value)
        {
            ZYAN_CHECK(formatter->func_print_disp(formatter, buffer, context));
        }
    }

    ZYDIS_BUFFER_APPEND(buffer, MEMORY_END_INTEL);
    return ZYAN_STATUS_SUCCESS;
}